

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseQueue.cpp
# Opt level: O2

int __thiscall Kernel::ClauseQueue::remove(ClauseQueue *this,char *__filename)

{
  Node *__ptr;
  Node *pNVar1;
  int iVar2;
  long lVar3;
  Node *pNVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  uVar5 = this->_height;
  pNVar4 = this->_left;
LAB_00422882:
  lVar7 = (ulong)uVar5 * 8 + 0x10;
  lVar3 = 0;
  do {
    __ptr = *(Node **)((long)pNVar4->nodes + lVar7 + -0x10);
    if (__ptr != (Node *)0x0) {
      if (__ptr->clause == (Clause *)__filename) {
        uVar6 = (ulong)uVar5 - lVar3;
        while( true ) {
          pNVar4->nodes[uVar6] = __ptr->nodes[uVar6];
          bVar8 = uVar6 == 0;
          uVar6 = uVar6 - 1;
          if (bVar8) break;
          pNVar1 = pNVar4;
          do {
            pNVar4 = pNVar1;
            pNVar1 = pNVar4->nodes[uVar6 & 0xffffffff];
          } while (pNVar4->nodes[uVar6 & 0xffffffff] != __ptr);
        }
        Lib::free(__ptr);
        uVar5 = this->_height;
        while( true ) {
          if ((uVar5 == 0) || (this->_left->nodes[uVar5] != (Node *)0x0)) break;
          this->_height = uVar5 - 1;
          uVar5 = uVar5 - 1;
        }
        return (int)CONCAT71((int7)((ulong)this >> 8),1);
      }
      iVar2 = (*this->_vptr_ClauseQueue[2])(this,__filename);
      if ((char)iVar2 == '\0') break;
    }
    if (uVar5 == (uint)lVar3) {
      return 0;
    }
    lVar3 = lVar3 + 1;
    lVar7 = lVar7 + -8;
  } while( true );
  uVar5 = uVar5 - (uint)lVar3;
  pNVar4 = __ptr;
  goto LAB_00422882;
}

Assistant:

bool ClauseQueue::remove(Clause* c)
{
  unsigned h = _height;
  Node* left = _left;

  for (;;) {
    Node* next = left->nodes[h];
    if (next && c == next->clause) {
      unsigned height = h;
      // found, first change the links going to next
      for (;;) {
	left->nodes[h] = next->nodes[h];
	if (h == 0) {
	  break;
	}
	h--;
	while (left->nodes[h] != next) {
	  left = left->nodes[h];
	}
      }
      // deallocate the node
      DEALLOC_KNOWN(next,
		    sizeof(Node)+height*sizeof(Node*),
		    "ClauseQueue::Node");
      while (_height > 0 && ! _left->nodes[_height]) {
	_height--;
      }
      return true;
    }

    if (next == 0 || lessThan(c,next->clause)) {
      if(h==0) {

#if VDEBUG
       ClauseQueue::Iterator it(*this);
       while(it.hasNext()){
         ASS(it.next()!=c);
       }
#endif

	return false;
      }
      h--;
    }
    else {
      left = next;
    }
  }
}